

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::CompressionParameters>::dispose(ArrayBuilder<kj::CompressionParameters> *this)

{
  CompressionParameters *firstElement;
  RemoveConst<kj::CompressionParameters> *pRVar1;
  CompressionParameters *pCVar2;
  CompressionParameters *endCopy;
  CompressionParameters *posCopy;
  CompressionParameters *ptrCopy;
  ArrayBuilder<kj::CompressionParameters> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pCVar2 = this->endPtr;
  if (firstElement != (CompressionParameters *)0x0) {
    this->ptr = (CompressionParameters *)0x0;
    this->pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    this->endPtr = (CompressionParameters *)0x0;
    ArrayDisposer::dispose<kj::CompressionParameters>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pCVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }